

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::clearIntensity(Station *this)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  long in_RDI;
  int j;
  int i;
  pair<int,_int> aux;
  Collimator *in_stack_ffffffffffffffc8;
  int local_20;
  pair<int,_int> local_1c;
  int local_14;
  pair<int,_int> local_10 [2];
  
  std::pair<int,_int>::pair<int,_int,_true>(local_10);
  for (local_14 = 0; iVar1 = local_14, iVar2 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
      iVar1 < iVar2; local_14 = local_14 + 1) {
    local_1c = Collimator::getActiveRange(in_stack_ffffffffffffffc8,0,0x134744);
    std::pair<int,_int>::operator=(local_10,&local_1c);
    if (-1 < local_10[0].first) {
      for (local_20 = local_10[0].first; local_20 <= local_10[0].second; local_20 = local_20 + 1) {
        pdVar3 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_20);
        *pdVar3 = 0.0;
      }
    }
  }
  return;
}

Assistant:

void Station::clearIntensity() {
    pair<int,int> aux;
    for (int i=0; i < collimator.getXdim(); i++) {
      aux = collimator.getActiveRange(i,angle);
      if (aux.first<0) continue;
      for (int j=aux.first; j<=aux.second; j++) I(i,j)=0;
    }
  }